

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourceCode.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_sourceCode_ensureLineStartIndexTableIsBuilt
          (sysbvm_context_t *context,sysbvm_tuple_t sourceCode)

{
  long lVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t sVar4;
  undefined8 local_48;
  size_t i;
  uint8_t *sourceCodeData;
  size_t sourceCodeTextSize;
  sysbvm_tuple_t orderedCollection;
  sysbvm_sourceCode_t *sourceCodeObject;
  sysbvm_tuple_t sourceCode_local;
  sysbvm_context_t *context_local;
  
  if (*(long *)(sourceCode + 0x40) == 0) {
    sVar2 = sysbvm_orderedCollection_create(context);
    sVar3 = sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(sourceCode + 0x10));
    lVar1 = *(long *)(sourceCode + 0x10);
    sVar4 = sysbvm_tuple_uint32_encode(context,0);
    sysbvm_orderedCollection_add(context,sVar2,sVar4);
    for (local_48 = 0; local_48 < sVar3; local_48 = local_48 + 1) {
      if (*(char *)(lVar1 + 0x10 + local_48) == '\n') {
        sVar4 = sysbvm_tuple_uint32_encode(context,(int)local_48 + 1);
        sysbvm_orderedCollection_add(context,sVar2,sVar4);
      }
    }
    sVar2 = sysbvm_orderedCollection_asArray(context,sVar2);
    *(sysbvm_tuple_t *)(sourceCode + 0x40) = sVar2;
    context_local = *(sysbvm_context_t **)(sourceCode + 0x40);
  }
  else {
    context_local = *(sysbvm_context_t **)(sourceCode + 0x40);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_sourceCode_ensureLineStartIndexTableIsBuilt(sysbvm_context_t *context, sysbvm_tuple_t sourceCode)
{
    sysbvm_sourceCode_t *sourceCodeObject = (sysbvm_sourceCode_t*)sourceCode;
    if(sourceCodeObject->lineStartIndexTable)
        return sourceCodeObject->lineStartIndexTable;

    sysbvm_tuple_t orderedCollection = sysbvm_orderedCollection_create(context);
    size_t sourceCodeTextSize = sysbvm_tuple_getSizeInBytes(sourceCodeObject->text);
    uint8_t *sourceCodeData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(sourceCodeObject->text)->bytes;

    sysbvm_orderedCollection_add(context, orderedCollection, sysbvm_tuple_uint32_encode(context, 0));
    for(size_t i = 0; i < sourceCodeTextSize; ++i)
    {
        if(sourceCodeData[i] == '\n')
            sysbvm_orderedCollection_add(context, orderedCollection, sysbvm_tuple_uint32_encode(context, i + 1));
    }

    sourceCodeObject->lineStartIndexTable = sysbvm_orderedCollection_asArray(context, orderedCollection);
    return sourceCodeObject->lineStartIndexTable;
}